

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool saveCameraCalibration(string *name,Mat *cameraMatrix,Mat *distortionCoefficients)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  int r;
  ulong uVar6;
  ushort uVar7;
  ushort uVar8;
  int c_1;
  int c;
  ulong uVar9;
  ushort local_258;
  ofstream outStream;
  uint auStack_210 [120];
  
  std::ofstream::ofstream(&outStream,(string *)name,_S_out);
  uVar2 = *(uint *)((long)auStack_210 + *(long *)(_outStream + -0x18));
  if ((uVar2 & 5) == 0) {
    uVar3 = *(uint *)(cameraMatrix + 8);
    uVar4 = *(uint *)(cameraMatrix + 0xc);
    uVar7 = (ushort)uVar3;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&outStream,uVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    local_258 = (ushort)uVar4;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&outStream,local_258);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"Camera matrix rows: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"Camera matrix rows: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_258);
    std::endl<char,std::char_traits<char>>(poVar5);
    for (uVar6 = 0; uVar6 != ((ulong)uVar3 & 0xffff); uVar6 = uVar6 + 1) {
      for (uVar9 = 0; ((ulong)uVar4 & 0xffff) != uVar9; uVar9 = uVar9 + 1) {
        dVar1 = *(double *)
                 (**(long **)(cameraMatrix + 0x48) * uVar6 + *(long *)(cameraMatrix + 0x10) +
                 uVar9 * 8);
        std::operator<<((ostream *)&std::cout,"..");
        poVar5 = std::ostream::_M_insert<double>(dVar1);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
    uVar3 = *(uint *)(distortionCoefficients + 8);
    uVar4 = *(uint *)(distortionCoefficients + 0xc);
    uVar8 = (ushort)uVar3;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&outStream,uVar8);
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar7 = (ushort)uVar4;
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&outStream,uVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"Distortion coefficient rows: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar8);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"Distortion coefficient columns: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    for (uVar6 = 0; uVar6 != ((ulong)uVar3 & 0xffff); uVar6 = uVar6 + 1) {
      for (uVar9 = 0; ((ulong)uVar4 & 0xffff) != uVar9; uVar9 = uVar9 + 1) {
        dVar1 = *(double *)
                 (**(long **)(distortionCoefficients + 0x48) * uVar6 +
                  *(long *)(distortionCoefficients + 0x10) + uVar9 * 8);
        std::operator<<((ostream *)&std::cout,"..");
        poVar5 = std::ostream::_M_insert<double>(dVar1);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&outStream);
  return (uVar2 & 5) == 0;
}

Assistant:

bool saveCameraCalibration(std::string name, cv::Mat cameraMatrix, cv::Mat distortionCoefficients) {
    std::ofstream outStream(name);
    if (outStream)
    {
        uint16_t rows = cameraMatrix.rows;
        uint16_t columns = cameraMatrix.cols;


        outStream << rows << std::endl;
        outStream << columns << std::endl;

        std::cout << "Camera matrix rows: " << rows << std::endl;
        std::cout << "Camera matrix rows: " << columns << std::endl;

        for (int r = 0; r < rows; r++) {
            for (int c = 0; c < columns; c++) {
                double value = cameraMatrix.at<double>(r, c);
                std::cout << "..";
                outStream << value << std::endl;
            }
        }
        std::cout << "\n";

        rows = distortionCoefficients.rows;
        columns = distortionCoefficients.cols;

        outStream << rows << std::endl;
        outStream << columns << std::endl;

        std::cout << "Distortion coefficient rows: " << rows << std::endl;
        std::cout << "Distortion coefficient columns: " << columns << std::endl;

        for (int r = 0; r < rows; r++) {
            for (int c = 0; c < columns; c++) {
                double value = distortionCoefficients.at<double>(r, c);
                std::cout << "..";
                outStream << value << std::endl;
            }
        }
        std::cout << "\n";

        outStream.close();
        return true;
    }
    return false;
}